

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_read_increment
                 (BitReadCtx_t *gbc,RK_U32 range_min,RK_U32 range_max,char *name,RK_U32 *write_to)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  RK_S32 _out;
  char local_34 [4];
  
  if ((range_max < range_min || 0x1f < range_max - range_min) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "range_min <= range_max && range_max - range_min < sizeof(bits) - 1",
                 "mpp_av1_read_increment",0x90), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  if (range_min < range_max) {
    do {
      RVar1 = mpp_get_bits_left(gbc);
      if (RVar1 < 1) {
        _mpp_log_l(2,"av1d_cbs","Invalid increment value at %s: bitstream ended.\n",
                   "mpp_av1_read_increment",name);
        return -1;
      }
      MVar2 = mpp_read_bits(gbc,1,(RK_S32 *)local_34);
      gbc->ret = MVar2;
      if (MVar2 != MPP_OK) {
        return -1;
      }
    } while ((local_34[0] != '\0') && (range_min = range_min + 1, range_min < range_max));
  }
  *write_to = range_min;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_read_increment(BitReadCtx_t *gbc, RK_U32 range_min,
                                     RK_U32 range_max, const char *name,
                                     RK_U32 *write_to)
{
    RK_U32 value;
    RK_S32 i;
    RK_S8 bits[33];

    mpp_assert(range_min <= range_max && range_max - range_min < sizeof(bits) - 1);

    for (i = 0, value = range_min; value < range_max;) {
        RK_U8 tmp = 0;
        if (mpp_get_bits_left(gbc) < 1) {
            mpp_err_f("Invalid increment value at "
                      "%s: bitstream ended.\n", name);
            return MPP_NOK;
        }
        READ_ONEBIT(gbc, &tmp);
        if (tmp) {
            bits[i++] = '1';
            ++value;
        } else {
            bits[i++] = '0';
            break;
        }
    }
    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;
}